

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepLoop::Read(ON_BrepLoop *this,ON_BinaryArchive *file)

{
  bool local_1d;
  ON__INT32 local_1c;
  bool rc;
  ON_BinaryArchive *pOStack_18;
  int i;
  ON_BinaryArchive *file_local;
  ON_BrepLoop *this_local;
  
  pOStack_18 = file;
  file_local = (ON_BinaryArchive *)this;
  local_1d = ON_BinaryArchive::ReadInt(file,&this->m_loop_index);
  if (local_1d) {
    local_1d = ON_BinaryArchive::ReadArray(pOStack_18,&this->m_ti);
  }
  local_1c = 0;
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::ReadInt(pOStack_18,&local_1c);
  }
  switch(local_1c) {
  case 0:
    this->m_type = unknown;
    break;
  case 1:
    this->m_type = outer;
    break;
  case 2:
    this->m_type = inner;
    break;
  case 3:
    this->m_type = slit;
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::ReadInt(pOStack_18,&this->m_fi);
  }
  return local_1d;
}

Assistant:

bool ON_BrepLoop::Read( ON_BinaryArchive& file )
{
  int i;
  bool rc = file.ReadInt( & m_loop_index );
  if (rc)
    rc = file.ReadArray( m_ti );

  i = unknown;
  if (rc)
    rc = file.ReadInt( &i );
  switch(i) {
  case unknown:
    m_type = unknown;
    break;
  case outer:
    m_type = outer;
    break;
  case inner:
    m_type = inner;
    break;
  case slit:
    m_type = slit;
    break;
  }

  if (rc)
    rc = file.ReadInt( &m_fi );
  return rc;
}